

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O0

uint32 google::protobuf::compiler::ComputeCRC32(string *buf)

{
  ulong uVar1;
  byte *pbVar2;
  int local_18;
  uint uStack_14;
  uchar c;
  int i;
  uint32 x;
  string *buf_local;
  
  uStack_14 = 0xffffffff;
  local_18 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= (ulong)(long)local_18) break;
    pbVar2 = (byte *)std::__cxx11::string::operator[]((ulong)buf);
    uStack_14 = *(uint *)(kCRC32Table + (ulong)((uStack_14 ^ *pbVar2) & 0xff) * 4) ^ uStack_14 >> 8;
    local_18 = local_18 + 1;
  }
  return uStack_14 ^ 0xffffffff;
}

Assistant:

static uint32 ComputeCRC32(const string &buf) {
  uint32 x = ~0U;
  for (int i = 0; i < buf.size(); ++i) {
    unsigned char c = buf[i];
    x = kCRC32Table[(x ^ c) & 0xff] ^ (x >> 8);
  }
  return ~x;
}